

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::CommandDiagReset
          (CommissionerSafe *this,ErrorHandler *aHandler,string *aAddr,uint64_t aDiagDataFlags)

{
  anon_class_80_4_75bccd57 local_98;
  AsyncRequest local_48;
  uint64_t local_28;
  uint64_t aDiagDataFlags_local;
  string *aAddr_local;
  ErrorHandler *aHandler_local;
  CommissionerSafe *this_local;
  
  local_98.this = this;
  local_28 = aDiagDataFlags;
  aDiagDataFlags_local = (uint64_t)aAddr;
  aAddr_local = (string *)aHandler;
  aHandler_local = (ErrorHandler *)this;
  std::function<void_(ot::commissioner::Error)>::function(&local_98.aHandler,aHandler);
  std::__cxx11::string::string((string *)&local_98.aAddr,(string *)aDiagDataFlags_local);
  local_98.aDiagDataFlags = local_28;
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::CommandDiagReset(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_long)::__0,void>
            ((function<void()> *)&local_48,&local_98);
  PushAsyncRequest(this,&local_48);
  std::function<void_()>::~function(&local_48);
  CommandDiagReset(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,unsigned_long)
  ::$_0::~__0((__0 *)&local_98);
  return;
}

Assistant:

void CommissionerSafe::CommandDiagReset(ErrorHandler aHandler, const std::string &aAddr, uint64_t aDiagDataFlags)
{
    PushAsyncRequest([=]() { mImpl->CommandDiagReset(aHandler, aAddr, aDiagDataFlags); });
}